

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::handle_join_leave_rpc_err(raft_server *this,msg_type t_msg,ptr<peer> *p)

{
  element_type *peVar1;
  long lVar2;
  int iVar3;
  iterator __it;
  string local_48;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (t_msg != leave_cluster_request) {
    if ((peVar1 != (element_type *)0x0) && (iVar3 = (*peVar1->_vptr_logger[7])(), 3 < iVar3)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_48,
                 "rpc failed again for the new coming server (%d), will stop retry for this server",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_join_leave_rpc_err",0x253,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int32)local_48._M_dataplus._M_p) !=
          &local_48.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_48._M_dataplus._M_p._4_4_,(int32)local_48._M_dataplus._M_p));
      }
    }
    this->config_changing_ = false;
    reset_srv_to_join(this);
    return;
  }
  if ((peVar1 != (element_type *)0x0) && (iVar3 = (*peVar1->_vptr_logger[7])(), 3 < iVar3)) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_48,"rpc failed for removing server (%d), will remove this server directly",
               (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->config_).
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id_);
    (*peVar1->_vptr_logger[8])
              (peVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
               ,"handle_join_leave_rpc_err",0x21f,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int32)local_48._M_dataplus._M_p) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_48._M_dataplus._M_p._4_4_,(int32)local_48._M_dataplus._M_p));
    }
  }
  if ((this->peers_)._M_h._M_element_count != 1) goto LAB_00186d96;
  local_48._M_dataplus._M_p._0_4_ =
       ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->config_).
        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
  __it = std::
         _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_48);
  if (__it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar3 = (*peVar1->_vptr_logger[7])(), 3 < iVar3)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_48,"peer %d cannot be found, no action for removing",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_join_leave_rpc_err",0x237,&local_48);
      goto LAB_00186d71;
    }
  }
  else {
    lVar2 = *(long *)((long)__it.
                            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                            ._M_cur + 0x10);
    if ((*(byte *)(lVar2 + 0x269) & 1) == 0) {
      *(undefined1 *)(lVar2 + 0x8a) = 0;
      (**(code **)(**(long **)(lVar2 + 0x10) + 0x18))(*(long **)(lVar2 + 0x10),lVar2 + 0x90);
      LOCK();
      *(undefined1 *)(*(long *)(lVar2 + 0x90) + 8) = 1;
      UNLOCK();
    }
    std::
    _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->peers_)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
            _M_cur);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar3 = (*peVar1->_vptr_logger[7])(), 3 < iVar3)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_48,"server %d is removed from cluster",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_join_leave_rpc_err",0x234,&local_48);
LAB_00186d71:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int32)local_48._M_dataplus._M_p) !=
          &local_48.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_48._M_dataplus._M_p._4_4_,(int32)local_48._M_dataplus._M_p));
      }
    }
  }
  if ((this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    reset_srv_to_leave(this);
  }
LAB_00186d96:
  if ((this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    rm_srv_from_cluster(this,((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->config_).
                              super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->id_);
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar3 = (*peVar1->_vptr_logger[7])(), 2 < iVar3)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_48,"srv_to_leave_ is already set to %d, will remove it from peer list",
                 (ulong)(uint)((((this->srv_to_leave_).
                                 super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                )->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar1->_vptr_logger[8])
                (peVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_join_leave_rpc_err",0x247,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int32)local_48._M_dataplus._M_p) !=
          &local_48.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_48._M_dataplus._M_p._4_4_,(int32)local_48._M_dataplus._M_p));
      }
    }
    remove_peer_from_peers(this,&this->srv_to_leave_);
    reset_srv_to_leave(this);
  }
  return;
}

Assistant:

void raft_server::handle_join_leave_rpc_err(msg_type t_msg, ptr<peer> p) {
    if (t_msg == msg_type::leave_cluster_request) {
        p_in( "rpc failed for removing server (%d), "
              "will remove this server directly",
              p->get_id() );

        /**
         * In case of there are only two servers in the cluster,
         * it will be safe to remove the server directly from peers
         * as at most one config change could happen at a time
         *   prove:
         *     assume there could be two config changes at a time
         *     this means there must be a leader after previous leader
         *     offline, which is impossible (no leader could be elected
         *     after one server goes offline in case of only two servers
         *     in a cluster)
         * so the bug
         *   https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E
         * does not apply to cluster which only has two members
         */
        if (peers_.size() == 1) {
            peer_itor pit = peers_.find(p->get_id());
            if (pit != peers_.end()) {
                pit->second->enable_hb(false);
                peers_.erase(pit);
                p_in("server %d is removed from cluster", p->get_id());
            } else {
                p_in("peer %d cannot be found, no action for removing",
                     p->get_id());
            }

            if (srv_to_leave_) {
                reset_srv_to_leave();
            }
        }

        if (srv_to_leave_) {
            // WARNING:
            //   If `srv_to_leave_` is already set, this function is probably
            //   invoked by `handle_hb_timeout`. In such a case, the server
            //   to be removed does not respond while the leader already
            //   generated the log for the configuration change. We should
            //   abandon the peer entry from `peers_`.
            p_wn("srv_to_leave_ is already set to %d, will remove it from "
                 "peer list", srv_to_leave_->get_id());
            remove_peer_from_peers(srv_to_leave_);
            reset_srv_to_leave();

        } else {
            // Set `srv_to_leave_` and generate a log for configuration change.
            rm_srv_from_cluster(p->get_id());
        }

    } else {
        p_in( "rpc failed again for the new coming server (%d), "
              "will stop retry for this server",
              p->get_id() );
        config_changing_ = false;
        reset_srv_to_join();
    }
}